

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t sVar6;
  iterator __position;
  iterator __position_00;
  pointer pBVar7;
  pointer pBVar8;
  Mat *this_02;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  byte bVar12;
  undefined4 extraout_EAX;
  float *pfVar13;
  ulong uVar14;
  BBoxRect *pBVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  pointer pMVar20;
  float *pfVar21;
  float *pfVar22;
  int iVar23;
  float *pfVar24;
  pointer pvVar25;
  uint uVar26;
  long lVar27;
  float fVar28;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar29;
  float fVar31;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM1_Qb;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  int local_1ec;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1e8;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_1c8;
  YoloDetectionOutput *local_1a8;
  float local_19c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_198;
  vector<float,_std::allocator<float>_> local_178;
  int local_160;
  Allocator *local_158;
  undefined4 local_150;
  int local_14c;
  int local_148;
  int local_144;
  ulong local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  vector<float,_std::allocator<float>_> local_128;
  int local_108;
  uint local_104;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  Option *local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined1 local_b8 [16];
  int local_a8;
  ulong local_a0;
  pointer local_98;
  long local_90;
  ulong local_88;
  float *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pMVar20 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_100 = bottom_top_blobs;
  local_f8 = opt;
  if ((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar20) {
    uVar16 = 0;
    local_1a8 = this;
    do {
      iVar23 = pMVar20[uVar16].c / this->num_box;
      if (iVar23 != this->num_class + 5) {
        iVar23 = -1;
        goto LAB_0016d531;
      }
      local_138 = *(float **)&pMVar20[uVar16].w;
      uStack_130 = 0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0 = uVar16;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize(&local_1c8,(long)this->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_1e8,(long)this->num_box);
      if (0 < this->num_box) {
        pMVar20 = pMVar20 + uVar16;
        auVar30._4_4_ = -(uint)(0 < (int)(float)local_138);
        auVar30._0_4_ = -(uint)(0 < (int)(float)local_138);
        auVar30._8_4_ = -(uint)(0 < local_138._4_4_);
        auVar30._12_4_ = -(uint)(0 < local_138._4_4_);
        local_104 = movmskpd(extraout_EAX,auVar30);
        bVar12 = (byte)local_104;
        auVar10._4_4_ = (float)local_138._4_4_;
        auVar10._0_4_ = (float)(int)(float)local_138;
        auVar10._8_4_ = (float)(int)uStack_130;
        auVar10._12_4_ = (float)uStack_130._4_4_;
        in_XMM1 = rcpps(in_XMM1,auVar10);
        local_78 = in_XMM1._0_4_;
        fStack_74 = in_XMM1._4_4_;
        fStack_70 = in_XMM1._8_4_;
        fStack_6c = in_XMM1._12_4_;
        local_78 = (1.0 - (float)(int)(float)local_138 * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_138._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (0.0 - (float)(int)uStack_130 * fStack_70) * fStack_70 + fStack_70;
        fStack_6c = (0.0 - (float)uStack_130._4_4_ * fStack_6c) * fStack_6c + fStack_6c;
        local_90 = (long)iVar23;
        local_88 = (ulong)local_138 & 0xffffffff;
        local_108 = local_138._4_4_;
        lVar27 = 0;
        local_98 = pMVar20;
        do {
          lVar17 = lVar27 * local_90;
          local_e8 = *(undefined8 *)((long)(this->biases).data + lVar27 * 8);
          uStack_e0 = 0;
          sVar6 = pMVar20->cstep;
          local_138 = (float *)pMVar20->data;
          pBVar15 = (BBoxRect *)pMVar20->elemsize;
          local_144 = this->num_class;
          local_14c = pMVar20->w;
          local_148 = pMVar20->h;
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((lVar17 + 5) * sVar6 * (long)pBVar15 + (long)local_138);
          local_160 = pMVar20->elempack;
          local_158 = pMVar20->allocator;
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_150 = 3;
          local_140 = ((long)(local_148 * local_14c) * (long)pBVar15 + 0xfU & 0xfffffffffffffff0) /
                      (ulong)pBVar15;
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pBVar15;
          (*this->softmax->_vptr_Layer[9])(this->softmax,&local_178,local_f8);
          local_f0 = lVar27;
          if (bVar12 >> 1 != 0) {
            pfVar13 = (float *)(sVar6 * lVar17 * (long)pBVar15 + (long)local_138);
            pfVar22 = (float *)((lVar17 + 1) * sVar6 * (long)pBVar15 + (long)local_138);
            pfVar18 = (float *)((lVar17 + 2) * sVar6 * (long)pBVar15 + (long)local_138);
            pfVar24 = (float *)((lVar17 + 3) * sVar6 * (long)pBVar15 + (long)local_138);
            pfVar21 = (float *)((lVar17 + 4) * sVar6 * (long)pBVar15 + (long)local_138);
            local_e8 = CONCAT44(local_e8._4_4_ * 0.5,(float)local_e8 * 0.5);
            uStack_e0 = CONCAT44(uStack_e0._4_4_ * 0.0,(float)uStack_e0 * 0.0);
            local_1ec = 0;
            do {
              if ((local_104 & 1) != 0) {
                local_68 = ZEXT416((uint)(float)local_1ec);
                lVar27 = 0;
                uVar16 = 0;
                do {
                  local_138 = (float *)CONCAT44(local_138._4_4_,*pfVar18);
                  local_c8 = *pfVar24;
                  local_d8 = -*pfVar13;
                  fStack_d4 = -*pfVar22;
                  uStack_d0 = 0x80000000;
                  uStack_cc = 0x80000000;
                  local_80 = pfVar13;
                  local_48 = expf(local_d8);
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(fStack_d4);
                  fStack_54 = extraout_XMM0_Db_00;
                  local_d8 = expf(local_c8);
                  local_c8 = expf((float)local_138);
                  local_138 = pfVar21;
                  fVar28 = expf(-*pfVar21);
                  lVar17 = local_f0;
                  if ((long)local_1a8->num_class < 1) {
                    iVar23 = 0;
                    auVar30 = ZEXT816(0);
                  }
                  else {
                    pfVar13 = (float *)((long)local_1ec * (long)local_14c *
                                        (long)local_178.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        lVar27 + (long)local_178.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                    fVar32 = 0.0;
                    uVar19 = 0;
                    uVar14 = 0;
                    do {
                      fVar29 = *pfVar13;
                      bVar9 = fVar32 < fVar29;
                      if (fVar29 <= fVar32) {
                        fVar29 = fVar32;
                      }
                      fVar32 = fVar29;
                      auVar30 = ZEXT416((uint)fVar32);
                      if (bVar9) {
                        uVar14 = uVar19 & 0xffffffff;
                      }
                      iVar23 = (int)uVar14;
                      uVar19 = uVar19 + 1;
                      pfVar13 = (float *)((long)pfVar13 +
                                         (long)local_178.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage *
                                         local_140);
                    } while ((long)local_1a8->num_class != uVar19);
                  }
                  in_XMM1._4_12_ = auVar30._4_12_;
                  in_XMM1._0_4_ = auVar30._0_4_ / (fVar28 + 1.0);
                  local_19c = in_XMM1._0_4_;
                  if (local_1a8->confidence_threshold <= in_XMM1._0_4_) {
                    auVar35._0_4_ = local_48 + 1.0;
                    auVar35._4_4_ = local_58 + 1.0;
                    auVar35._8_4_ = fStack_44 + 0.0;
                    auVar35._12_4_ = fStack_54 + 0.0;
                    auVar30 = rcpps(in_XMM1,auVar35);
                    fVar28 = auVar30._0_4_;
                    fVar32 = auVar30._4_4_;
                    fVar28 = ((float)(int)uVar16 + fVar28 + (1.0 - auVar35._0_4_ * fVar28) * fVar28)
                             * local_78;
                    fVar32 = ((float)local_68._0_4_ + fVar32 +
                             (1.0 - auVar35._4_4_ * fVar32) * fVar32) * fStack_74;
                    fVar33 = local_c8 * (float)local_e8 * local_78;
                    fVar34 = local_d8 * local_e8._4_4_ * fStack_74;
                    fVar29 = fVar28 - fVar33;
                    fVar31 = fVar32 - fVar34;
                    fVar33 = fVar33 + fVar28;
                    fVar34 = fVar34 + fVar32;
                    in_XMM1 = CONCAT88(CONCAT44(fVar34,fVar33),CONCAT44(fVar31,fVar29));
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_f0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_b8 = in_XMM1;
                    local_a8 = iVar23;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_b8);
                    }
                    else {
                      (__position._M_current)->label = iVar23;
                      (__position._M_current)->xmin = fVar29;
                      (__position._M_current)->ymin = fVar31;
                      (__position._M_current)->xmax = fVar33;
                      (__position._M_current)->ymax = fVar34;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_1e8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_19c);
                    }
                    else {
                      *__position_00._M_current = local_19c;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar13 = local_80 + 1;
                  pfVar22 = pfVar22 + 1;
                  pfVar18 = pfVar18 + 1;
                  pfVar24 = pfVar24 + 1;
                  pfVar21 = local_138 + 1;
                  uVar16 = uVar16 + 1;
                  lVar27 = lVar27 + 4;
                } while (uVar16 != local_88);
              }
              local_1ec = local_1ec + 1;
            } while (local_1ec != local_108);
          }
          pMVar20 = local_98;
          lVar27 = local_f0;
          this = local_1a8;
          if ((BBoxRect *)
              local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != (BBoxRect *)0x0) {
            LOCK();
            *local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 (float)((int)*local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
            UNLOCK();
            if (*local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish == 0.0) {
              if (local_158 == (Allocator *)0x0) {
                if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (float *)0x0) {
                  free(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
                }
              }
              else {
                (**(code **)(*(long *)local_158 + 0x18))();
                in_XMM1._8_8_ = extraout_XMM1_Qb;
                in_XMM1._0_8_ = extraout_XMM1_Qa;
              }
            }
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < this->num_box);
        if (0 < this->num_box) {
          lVar27 = 8;
          lVar17 = 0;
          do {
            pvVar25 = local_1e8.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                      ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                       local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar27 + -8),
                       *(undefined8 *)
                        ((long)&((local_1c8.
                                  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)
                                ._M_impl.super__Vector_impl_data._M_start + lVar27));
            std::vector<float,std::allocator<float>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                      ((vector<float,std::allocator<float>> *)&local_128,
                       local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       *(undefined8 *)((long)pvVar25 + lVar27 + -8),
                       *(undefined8 *)
                        ((long)&(pvVar25->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                .super__Vector_impl_data._M_start + lVar27));
            lVar17 = lVar17 + 1;
            lVar27 = lVar27 + 0x18;
          } while (lVar17 < this->num_box);
        }
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1e8);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      uVar16 = local_a0 + 1;
      pMVar20 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(local_100->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 6))
    ;
    if ((local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::BBoxRect>
                (&local_198,&local_128,0,
                 (int)((ulong)((long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  pBVar7 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar8 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8 = (YoloDetectionOutput *)CONCAT44(local_1a8._4_4_,this->nms_threshold);
  pvVar25 = (pointer)(((long)local_198.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_198.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_178,(size_type)pvVar25,(allocator_type *)&local_1e8);
  if (pBVar7 != pBVar8) {
    pfVar13 = &(local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    lVar27 = 0;
    do {
      uVar3 = ((BBoxRect *)(pfVar13 + -2))->xmin;
      uVar4 = ((BBoxRect *)(pfVar13 + -2))->ymin;
      local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar27] =
           ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar13 - (float)uVar3);
      lVar27 = lVar27 + 1;
      pfVar13 = pfVar13 + 5;
    } while ((long)&(pvVar25->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start + (ulong)(pvVar25 == (pointer)0x0) != lVar27);
    local_1e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      uVar26 = (uint)((ulong)((long)local_1c8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1c8.
                                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((int)uVar26 < 1) {
LAB_0016d2a4:
        if (local_1c8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1c8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1c8,
                     (iterator)
                     local_1c8.
                     super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1e8);
        }
        else {
          *(pointer *)
           local_1c8.
           super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish =
               local_1e8.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
        }
      }
      else {
        pBVar8 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 (long)local_1e8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        fVar28 = pBVar8->xmin;
        bVar9 = true;
        uVar16 = 0;
        do {
          pBVar7 = (&((local_1c8.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                     super__Vector_impl_data._M_start)[uVar16];
          fVar32 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pBVar7].xmax;
          fVar29 = 0.0;
          if (fVar28 <= fVar32) {
            pBVar1 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)pBVar7;
            fVar31 = pBVar8->xmax;
            fVar33 = pBVar1->xmin;
            if (fVar33 <= fVar31) {
              fVar34 = pBVar8->ymin;
              fVar36 = pBVar1->ymax;
              if (fVar34 <= fVar36) {
                fVar2 = pBVar8->ymax;
                fVar37 = pBVar1->ymin;
                if (fVar37 <= fVar2) {
                  if (fVar31 <= fVar32) {
                    fVar32 = fVar31;
                  }
                  if (fVar33 <= fVar28) {
                    fVar33 = fVar28;
                  }
                  if (fVar2 <= fVar36) {
                    fVar36 = fVar2;
                  }
                  if (fVar37 <= fVar34) {
                    fVar37 = fVar34;
                  }
                  fVar29 = (fVar36 - fVar37) * (fVar32 - fVar33);
                }
              }
            }
          }
          if (local_1a8._0_4_ <
              fVar29 / ((local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)local_1e8.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start] - fVar29) +
                       local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pBVar7])) {
            bVar9 = false;
          }
          uVar16 = uVar16 + 1;
        } while ((uVar26 & 0x7fffffff) != uVar16);
        if (bVar9) goto LAB_0016d2a4;
      }
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_1e8.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1);
    } while (local_1e8.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start < pvVar25);
  }
  if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar23 = 0;
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 0;
    do {
      pBVar8 = (&((local_1c8.
                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                 super__Vector_impl_data._M_start)[uVar16];
      pBVar15 = local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)pBVar8;
      if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_178,
                   (iterator)
                   local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,pBVar15);
      }
      else {
        *(int *)((long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x10) = pBVar15->label;
        fVar28 = pBVar15->ymin;
        uVar11 = *(undefined8 *)&pBVar15->xmax;
        local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[0] = pBVar15->xmin;
        local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[1] = fVar28;
        *(undefined8 *)
         ((long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = uVar11;
        local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_178.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if (local_1e8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)pBVar8);
      }
      else {
        *(float *)local_1e8.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pBVar8];
        local_1e8.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1e8.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)local_1c8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1c8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    uVar26 = (int)((long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar23 = 0;
    if (uVar26 != 0) {
      this_02 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar26,4,local_f8->blob_allocator);
      iVar23 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar23 = 0, 0 < (int)uVar26)) {
        iVar5 = this_02->w;
        sVar6 = this_02->elemsize;
        pfVar13 = (float *)((long)this_02->data + 0x14);
        pfVar18 = local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        iVar23 = 0;
        uVar16 = 0;
        do {
          fVar28 = *(float *)((long)&((local_1e8.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_start + uVar16 * 4);
          pfVar13[-5] = (float)(int)((int)*pfVar18 + 1);
          pfVar13[-4] = fVar28;
          pfVar13[-3] = pfVar18[-4];
          pfVar13[-2] = pfVar18[-3];
          pfVar13[-1] = pfVar18[-2];
          *pfVar13 = pfVar18[-1];
          uVar16 = uVar16 + 1;
          pfVar13 = (float *)((long)pfVar13 + (long)iVar5 * sVar6);
          pfVar18 = pfVar18 + 5;
        } while ((uVar26 & 0x7fffffff) != uVar16);
      }
    }
  }
  if (local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0016d531:
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar23;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / w);
                    float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / h);

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}